

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O0

file_flags_t __thiscall libtorrent::file_storage::file_flags(file_storage *this,file_index_t index)

{
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> bVar1;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_2a;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_29;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_28;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_27;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_26;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_25;
  int local_24;
  value_type *local_20;
  file_entry *fe;
  file_storage *this_local;
  file_index_t index_local;
  
  local_24 = index.m_val;
  fe = (file_entry *)this;
  this_local._0_4_ = index.m_val;
  local_20 = libtorrent::aux::
             container_wrapper<libtorrent::aux::file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>_>
             ::operator[](&this->m_files,
                          (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)index.m_val);
  if ((*(ulong *)&local_20->field_0x8 >> 0x3c & 1) == 0) {
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::bitfield_flag
              (&local_27);
  }
  else {
    local_27.m_val = '\x01';
  }
  if ((*(ulong *)&local_20->field_0x8 >> 0x3d & 1) == 0) {
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::bitfield_flag
              (&local_28);
  }
  else {
    local_28.m_val = '\x02';
  }
  local_26 = libtorrent::flags::operator|(local_27,local_28);
  if ((*(ulong *)&local_20->field_0x8 >> 0x3e & 1) == 0) {
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::bitfield_flag
              (&local_29);
  }
  else {
    local_29.m_val = '\x04';
  }
  local_25 = libtorrent::flags::operator|(local_26,local_29);
  if (*(long *)&local_20->field_0x8 < 0) {
    local_2a.m_val = '\b';
  }
  else {
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>::bitfield_flag
              (&local_2a);
  }
  bVar1 = libtorrent::flags::operator|(local_25,local_2a);
  return (file_flags_t)bVar1.m_val;
}

Assistant:

file_flags_t file_storage::file_flags(file_index_t const index) const
	{
		TORRENT_ASSERT_PRECOND(index >= file_index_t(0) && index < end_file());
		aux::file_entry const& fe = m_files[index];
		return (fe.pad_file ? file_storage::flag_pad_file : file_flags_t{})
			| (fe.hidden_attribute ? file_storage::flag_hidden : file_flags_t{})
			| (fe.executable_attribute ? file_storage::flag_executable : file_flags_t{})
			| (fe.symlink_attribute ? file_storage::flag_symlink : file_flags_t{});
	}